

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::toggle_create_joint_action(Application *this)

{
  Application *this_local;
  
  if (this->action == CreateJoint) {
    this->action = Object;
    setGhosted(this,false);
  }
  else {
    this->action = CreateJoint;
    setGhosted(this,true);
  }
  return;
}

Assistant:

void Application::toggle_create_joint_action()
{
   if (action != Action::CreateJoint)
   {
      action = Action::CreateJoint;
      setGhosted(true);
   }
   else
   {
      action = Action::Object;
      setGhosted(false);
   }
}